

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSkinMeshBuffer.h
# Opt level: O0

vector3df * __thiscall irr::scene::SSkinMeshBuffer::getNormal(SSkinMeshBuffer *this,u32 i)

{
  int iVar1;
  S3DVertex2TCoords *pSVar2;
  S3DVertexTangents *pSVar3;
  S3DVertex *pSVar4;
  array<irr::video::S3DVertex> *in_RDI;
  u32 in_stack_ffffffffffffffdc;
  vector3df *local_8;
  
  iVar1 = *(int *)&in_RDI[0xc].m_data.
                   super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1 == 1) {
    pSVar2 = core::array<irr::video::S3DVertex2TCoords>::operator[]
                       ((array<irr::video::S3DVertex2TCoords> *)in_RDI,in_stack_ffffffffffffffdc);
    local_8 = &(pSVar2->super_S3DVertex).Normal;
  }
  else if (iVar1 == 2) {
    pSVar3 = core::array<irr::video::S3DVertexTangents>::operator[]
                       ((array<irr::video::S3DVertexTangents> *)in_RDI,in_stack_ffffffffffffffdc);
    local_8 = &(pSVar3->super_S3DVertex).Normal;
  }
  else {
    pSVar4 = core::array<irr::video::S3DVertex>::operator[](in_RDI,in_stack_ffffffffffffffdc);
    local_8 = &pSVar4->Normal;
  }
  return local_8;
}

Assistant:

core::vector3df &getNormal(u32 i) override
	{
		switch (VertexType) {
		case video::EVT_2TCOORDS:
			return Vertices_2TCoords[i].Normal;
		case video::EVT_TANGENTS:
			return Vertices_Tangents[i].Normal;
		default:
			return Vertices_Standard[i].Normal;
		}
	}